

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoveFinder.cpp
# Opt level: O0

MoveFinder * __thiscall
senjo::MoveFinder::KnightMove_abi_cxx11_(MoveFinder *this,char *p,Square *from,Square *to)

{
  char cVar1;
  int iVar2;
  long lVar3;
  string move;
  Square *to_local;
  Square *from_local;
  char *p_local;
  MoveFinder *this_local;
  
  from_local = from;
  p_local = p;
  this_local = this;
  cVar1 = Friend((MoveFinder *)p,'N');
  PieceMove_abi_cxx11_
            ((MoveFinder *)&stack0xffffffffffffffb0,(char **)p,(char)&from_local,
             (Square *)(ulong)(uint)(int)cVar1,to);
  lVar3 = std::__cxx11::string::size();
  if ((lVar3 != 0) && ((char)from_local->sqr != '\0')) {
    iVar2 = isspace((int)(char)from_local->sqr);
    if (iVar2 == 0) {
      std::__cxx11::string::string((string *)this);
      goto LAB_0016a89f;
    }
  }
  std::__cxx11::string::string((string *)this,(string *)&stack0xffffffffffffffb0);
LAB_0016a89f:
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
  return this;
}

Assistant:

std::string MoveFinder::KnightMove(const char* p, Square from, Square to) const
{
  std::string move = PieceMove(p, Friend('N'), from, to);
  if (move.size() && *p && !isspace(*p)) {
    return std::string();
  }
  return move;
}